

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::InlineGreedyStringParser(string *s,char *ptr,ParseContext *ctx)

{
  string *in_RDX;
  long in_RSI;
  char *in_RDI;
  int size;
  EpsCopyInputStream *in_stack_fffffffffffffff8;
  char *pcVar1;
  
  ReadSize((char **)ctx);
  if (in_RSI == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = EpsCopyInputStream::ReadString
                       (in_stack_fffffffffffffff8,in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
  }
  return pcVar1;
}

Assistant:

const char* InlineGreedyStringParser(std::string* s, const char* ptr,
                                     ParseContext* ctx) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  return ctx->ReadString(ptr, size, s);
}